

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::AddComponentsToCompositesForLoads
          (InterfaceVariableScalarReplacement *this,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_component_values,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,uint32_t depth_to_component)

{
  Instruction *this_00;
  iterator iVar1;
  Instruction *inst;
  __hashtable *__h;
  __node_base *p_Var2;
  initializer_list<unsigned_int> init_list;
  Instruction *load;
  uint32_t local_a0;
  uint32_t local_9c;
  InterfaceVariableScalarReplacement *local_98;
  DefUseManager *local_90;
  Instruction *local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_a0 = depth_to_component;
  local_98 = this;
  local_90 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  p_Var2 = &(loads_to_component_values->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    load = *(Instruction **)(p_Var2 + 1);
    this_00 = *(Instruction **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
    iVar1 = std::
            _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&loads_to_composites->_M_h,&load);
    if (iVar1.
        super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
        ._M_cur == (__node_type *)0x0) {
      inst = CreateCompositeConstructForComponentOfLoad(local_98,load,local_a0);
      local_88 = load;
      local_80._vptr_SmallVector = (_func_int **)inst;
      std::
      _Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>
                ((_Hashtable<spvtools::opt::Instruction*,std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>,std::allocator<std::pair<spvtools::opt::Instruction*const,spvtools::opt::Instruction*>>,std::__detail::_Select1st,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)loads_to_composites,(Operand *)&local_88);
    }
    else {
      inst = *(Instruction **)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_false>
                     ._M_cur + 0x10);
    }
    local_9c = Instruction::result_id(this_00);
    init_list._M_len = 1;
    init_list._M_array = &local_9c;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_88 = (Instruction *)CONCAT44(local_88._4_4_,1);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&inst->operands_,(Operand *)&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    analysis::DefUseManager::AnalyzeInstDefUse(local_90,inst);
  }
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::AddComponentsToCompositesForLoads(
    const std::unordered_map<Instruction*, Instruction*>&
        loads_to_component_values,
    std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
    uint32_t depth_to_component) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  for (auto& load_and_component_vale : loads_to_component_values) {
    Instruction* load = load_and_component_vale.first;
    Instruction* component_value = load_and_component_vale.second;
    Instruction* composite_construct = nullptr;
    auto itr = loads_to_composites->find(load);
    if (itr == loads_to_composites->end()) {
      composite_construct =
          CreateCompositeConstructForComponentOfLoad(load, depth_to_component);
      loads_to_composites->insert({load, composite_construct});
    } else {
      composite_construct = itr->second;
    }
    composite_construct->AddOperand(
        {SPV_OPERAND_TYPE_ID, {component_value->result_id()}});
    def_use_mgr->AnalyzeInstDefUse(composite_construct);
  }
}